

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O2

Statement * __thiscall soul::ModuleCloner::cloneStatement(ModuleCloner *this,Statement *s)

{
  int iVar1;
  AssignFromValue *__fn;
  undefined4 extraout_var;
  FunctionCall *__fn_00;
  undefined4 extraout_var_00;
  ReadStream *__fn_01;
  undefined4 extraout_var_01;
  WriteStream *__fn_02;
  undefined4 extraout_var_02;
  AdvanceClock *__fn_03;
  undefined4 extraout_var_03;
  int in_ECX;
  void *__child_stack;
  void *__child_stack_00;
  void *__child_stack_01;
  void *__child_stack_02;
  void *__child_stack_03;
  void *in_R8;
  pool_ptr<const_soul::heart::AssignFromValue> t;
  pool_ptr<const_soul::heart::FunctionCall> local_20;
  Statement *pSVar2;
  
  cast<soul::heart::AssignFromValue_const,soul::heart::Statement>((soul *)&local_20,s);
  if (local_20.object == (FunctionCall *)0x0) {
    cast<soul::heart::FunctionCall_const,soul::heart::Statement>((soul *)&local_20,s);
    if (local_20.object == (FunctionCall *)0x0) {
      cast<soul::heart::ReadStream_const,soul::heart::Statement>((soul *)&local_20,s);
      if (local_20.object == (FunctionCall *)0x0) {
        cast<soul::heart::WriteStream_const,soul::heart::Statement>((soul *)&local_20,s);
        if (local_20.object == (FunctionCall *)0x0) {
          cast<soul::heart::AdvanceClock_const,soul::heart::Statement>((soul *)&local_20,s);
          if (local_20.object == (FunctionCall *)0x0) {
            throwInternalCompilerError("cloneStatement",0x140);
          }
          __fn_03 = pool_ptr<const_soul::heart::AdvanceClock>::operator*
                              ((pool_ptr<const_soul::heart::AdvanceClock> *)&local_20);
          iVar1 = clone(this,(__fn *)__fn_03,__child_stack_03,in_ECX,in_R8);
          pSVar2 = (Statement *)CONCAT44(extraout_var_03,iVar1);
        }
        else {
          __fn_02 = pool_ptr<const_soul::heart::WriteStream>::operator*
                              ((pool_ptr<const_soul::heart::WriteStream> *)&local_20);
          iVar1 = clone(this,(__fn *)__fn_02,__child_stack_02,in_ECX,in_R8);
          pSVar2 = (Statement *)CONCAT44(extraout_var_02,iVar1);
        }
      }
      else {
        __fn_01 = pool_ptr<const_soul::heart::ReadStream>::operator*
                            ((pool_ptr<const_soul::heart::ReadStream> *)&local_20);
        iVar1 = clone(this,(__fn *)__fn_01,__child_stack_01,in_ECX,in_R8);
        pSVar2 = (Statement *)CONCAT44(extraout_var_01,iVar1);
      }
    }
    else {
      __fn_00 = pool_ptr<const_soul::heart::FunctionCall>::operator*(&local_20);
      iVar1 = clone(this,(__fn *)__fn_00,__child_stack_00,in_ECX,in_R8);
      pSVar2 = (Statement *)CONCAT44(extraout_var_00,iVar1);
    }
  }
  else {
    __fn = pool_ptr<const_soul::heart::AssignFromValue>::operator*
                     ((pool_ptr<const_soul::heart::AssignFromValue> *)&local_20);
    iVar1 = clone(this,(__fn *)__fn,__child_stack,in_ECX,in_R8);
    pSVar2 = (Statement *)CONCAT44(extraout_var,iVar1);
  }
  return pSVar2;
}

Assistant:

heart::Statement& cloneStatement (heart::Statement& s)
    {
        #define SOUL_CLONE_STATEMENT(Type)     if (auto t = cast<const heart::Type> (s)) return clone (*t);
        SOUL_HEART_STATEMENTS (SOUL_CLONE_STATEMENT)
        #undef SOUL_CLONE_STATEMENT
        SOUL_ASSERT_FALSE;
        return s;
    }